

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O3

gravity_map_t * gravity_map_deserialize(gravity_vm *vm,json_value *json)

{
  uint n;
  json_object_entry *pjVar1;
  char *pcVar2;
  json_value *entry;
  uint uVar3;
  gravity_map_t *pgVar4;
  uint32_t uVar5;
  gravity_map_t *pgVar6;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 obj;
  size_t sVar7;
  gravity_class_t *pgVar8;
  gravity_class_t *pgVar9;
  gravity_class_t **ppgVar10;
  uint uVar11;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 obj_00;
  long lVar12;
  gravity_value_t key;
  gravity_value_t value;
  gravity_map_t *local_60;
  
  n = (json->u).string.length;
  pgVar6 = gravity_map_new(vm,n);
  pgVar4 = pgVar6;
  if ((ulong)n != 0) {
    local_60 = (gravity_map_t *)0x0;
    lVar12 = 0;
    do {
      pjVar1 = (json->u).object.values;
      pcVar2 = *(char **)((long)&pjVar1->name + lVar12);
      entry = *(json_value **)((long)&pjVar1->value + lVar12);
      obj.p = (gravity_object_t *)gravity_calloc((gravity_vm *)0x0,1,0x48);
      sVar7 = strlen(pcVar2);
      uVar5 = (uint32_t)sVar7;
      uVar11 = uVar5 + 1;
      if (uVar5 + 1 < 0x21) {
        uVar11 = 0x20;
      }
      pgVar8 = (gravity_class_t *)gravity_calloc((gravity_vm *)0x0,1,(ulong)uVar11);
      memcpy(pgVar8,pcVar2,sVar7 & 0xffffffff);
      (obj.p)->isa = gravity_class_string;
      (obj.p)->objclass = pgVar8;
      *(uint32_t *)((long)&(obj.p)->identifier + 4) = uVar5;
      *(char *)((long)obj + 0x40) = (char)uVar11;
      *(char *)((long)obj + 0x41) = (char)(uVar11 >> 8);
      *(char *)((long)obj + 0x42) = (char)(uVar11 >> 0x10);
      *(char *)((long)obj + 0x43) = (char)(uVar11 >> 0x18);
      uVar5 = gravity_hash_compute_buffer((char *)pgVar8,uVar5);
      *(uint32_t *)&(obj.p)->identifier = uVar5;
      pgVar8 = gravity_class_string;
      if (vm != (gravity_vm *)0x0) {
        gravity_vm_transfer(vm,obj.p);
      }
      pgVar4 = local_60;
      switch(entry->type) {
      case json_object:
        obj_00.p = gravity_object_deserialize(vm,entry);
        ppgVar10 = &(obj_00.p)->isa;
        if ((gravity_object_t *)obj_00.n == (gravity_object_t *)0x0) {
          ppgVar10 = &gravity_class_null;
        }
        pgVar9 = ((gravity_object_t *)ppgVar10)->isa;
        break;
      default:
        goto switchD_0012dd5d_caseD_2;
      case json_integer:
        ppgVar10 = &gravity_class_int;
        goto LAB_0012de5e;
      case json_double:
        ppgVar10 = &gravity_class_float;
LAB_0012de5e:
        pgVar9 = *ppgVar10;
        obj_00 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)(entry->u).integer;
        break;
      case json_string:
        pcVar2 = (entry->u).string.ptr;
        uVar11 = (entry->u).string.length;
        obj_00.p = (gravity_object_t *)gravity_calloc((gravity_vm *)0x0,1,0x48);
        if (uVar11 == 0xffffffff) {
          sVar7 = strlen(pcVar2);
          uVar11 = (uint)sVar7;
        }
        uVar3 = uVar11 + 1;
        if (uVar11 + 1 < 0x21) {
          uVar3 = 0x20;
        }
        pgVar9 = (gravity_class_t *)gravity_calloc((gravity_vm *)0x0,1,(ulong)uVar3);
        memcpy(pgVar9,pcVar2,(ulong)uVar11);
        (obj_00.p)->isa = gravity_class_string;
        (obj_00.p)->objclass = pgVar9;
        *(uint *)((long)&(obj_00.p)->identifier + 4) = uVar11;
        *(char *)((long)obj_00 + 0x40) = (char)uVar3;
        *(char *)((long)obj_00 + 0x41) = (char)(uVar3 >> 8);
        *(char *)((long)obj_00 + 0x42) = (char)(uVar3 >> 0x10);
        *(char *)((long)obj_00 + 0x43) = (char)(uVar3 >> 0x18);
        uVar5 = gravity_hash_compute_buffer((char *)pgVar9,uVar11);
        *(uint32_t *)&(obj_00.p)->identifier = uVar5;
        pgVar9 = gravity_class_string;
        if (vm != (gravity_vm *)0x0) {
          gravity_vm_transfer(vm,obj_00.p);
        }
        break;
      case json_boolean:
        obj_00 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)(long)(entry->u).boolean;
        pgVar9 = gravity_class_bool;
        break;
      case json_null:
        obj_00.n = 0;
        pgVar9 = gravity_class_null;
      }
      key.field_1.p = (gravity_object_t *)obj.n;
      key.isa = pgVar8;
      value.field_1.n = obj_00.n;
      value.isa = pgVar9;
      gravity_hash_insert(pgVar6->hash,key,value);
      lVar12 = lVar12 + 0x18;
      pgVar4 = pgVar6;
    } while ((ulong)n * 0x18 != lVar12);
  }
switchD_0012dd5d_caseD_2:
  local_60 = pgVar4;
  return local_60;
}

Assistant:

static gravity_map_t *gravity_map_deserialize (gravity_vm *vm, json_value *json) {
    uint32_t n = json->u.object.length;
    gravity_map_t *map = gravity_map_new(vm, n);

    DEBUG_DESERIALIZE("DESERIALIZE MAP: %p\n", map);

    for (uint32_t i=0; i<n; ++i) { // from 1 to skip type
        const char *label = json->u.object.values[i].name;
        json_value *jsonv = json->u.object.values[i].value;

        gravity_value_t key = VALUE_FROM_CSTRING(vm, label);
        gravity_value_t value;

        switch (jsonv->type) {
            case json_integer:
                value = VALUE_FROM_INT((gravity_int_t)jsonv->u.integer); break;
            case json_double:
                value = VALUE_FROM_FLOAT((gravity_float_t)jsonv->u.dbl); break;
            case json_boolean:
                value = VALUE_FROM_BOOL(jsonv->u.boolean); break;
            case json_string:
                value = VALUE_FROM_STRING(vm, jsonv->u.string.ptr, jsonv->u.string.length); break;
            case json_null:
                value = VALUE_FROM_NULL; break;
            case json_object: {
                gravity_object_t *obj = gravity_object_deserialize(vm, jsonv);
                value = (obj) ? VALUE_FROM_OBJECT(obj) : VALUE_FROM_NULL;
                break;
            }
            case json_array: {
                
            }
            default:
                goto abort_load;
        }

        gravity_map_insert(NULL, map, key, value);
    }
    return map;

abort_load:
    // do not free map here because it is already garbage collected
    return NULL;
}